

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardConfigTab.cpp
# Opt level: O0

QVariant * __thiscall
ShortcutTableModel::headerData
          (QVariant *__return_storage_ptr__,ShortcutTableModel *this,int section,
          Orientation orientation,int role)

{
  QString local_68;
  QString local_40;
  int local_24;
  Orientation local_20;
  int role_local;
  Orientation orientation_local;
  int section_local;
  ShortcutTableModel *this_local;
  
  local_24 = role;
  local_20 = orientation;
  role_local = section;
  _orientation_local = this;
  this_local = (ShortcutTableModel *)__return_storage_ptr__;
  if ((orientation == Horizontal) && (role == 0)) {
    if (section == 0) {
      tr(&local_40,"Action",(char *)0x0,-1);
      QVariant::QVariant(__return_storage_ptr__,(QString *)&local_40);
      QString::~QString(&local_40);
      return __return_storage_ptr__;
    }
    if (section == 1) {
      tr(&local_68,"Key sequence",(char *)0x0,-1);
      QVariant::QVariant(__return_storage_ptr__,(QString *)&local_68);
      QString::~QString(&local_68);
      return __return_storage_ptr__;
    }
  }
  QVariant::QVariant(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

virtual QVariant headerData(int section, Qt::Orientation orientation, int role = Qt::DisplayRole) const override {
        if (orientation == Qt::Horizontal && role == Qt::DisplayRole) {
            switch (section) {
                case 0:
                    return tr("Action");
                case 1:
                    return tr("Key sequence");
                default:
                    break;
            }
        }

        return {};
    }